

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O1

Vec_Ptr_t * Abc_NtkComputeSupportsNaive(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  Abc_Obj_t *in_RAX;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  Abc_Obj_t *pAVar8;
  Abc_Obj_t *pAVar9;
  long lVar10;
  long lVar11;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_38;
  
  pVVar4 = pNtk->vCis;
  pAVar8 = (Abc_Obj_t *)(long)pVVar4->nSize;
  local_38 = in_RAX;
  if (0 < (long)pAVar8) {
    pAVar9 = (Abc_Obj_t *)0x0;
    do {
      local_38 = (Abc_Obj_t *)pVVar4->pArray[(long)pAVar9];
      local_38->pNext = pAVar9;
      pAVar9 = (Abc_Obj_t *)((long)&pAVar9->pNtk + 1);
    } while (pAVar8 != pAVar9);
  }
  iVar3 = pNtk->vCos->nSize;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar7 = 8;
  if (6 < iVar3 - 1U) {
    iVar7 = iVar3;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar7;
  if (iVar7 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar7 << 3);
  }
  pVVar4->pArray = ppvVar5;
  pVVar6 = pNtk->vCos;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar6->pArray[lVar11];
      if ((*(uint *)((long)local_38->pNtk->vObjs->pArray[*(local_38->vFanins).pArray] + 0x14) & 0xf)
          == 7) {
        pVVar6 = Abc_NtkNodeSupport(pNtk,&local_38,1);
        iVar3 = pVVar6->nSize;
        if (0 < iVar3) {
          ppvVar5 = pVVar6->pArray;
          lVar10 = 0;
          do {
            *(undefined4 *)((long)ppvVar5 + lVar10 * 4) = *(undefined4 *)((long)ppvVar5[lVar10] + 8)
            ;
            lVar10 = lVar10 + 1;
            iVar3 = pVVar6->nSize;
          } while (lVar10 < iVar3);
        }
        qsort(pVVar6->pArray,(long)iVar3,4,Vec_IntSortCompare1);
        Vec_IntPush((Vec_Int_t *)pVVar6,(int)lVar11);
        uVar1 = pVVar4->nSize;
        uVar2 = pVVar4->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            iVar3 = 0x10;
          }
          else {
            iVar3 = uVar2 * 2;
            if (iVar3 <= (int)uVar2) goto LAB_002e8ac6;
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = iVar3;
        }
LAB_002e8ac6:
        pVVar4->nSize = uVar1 + 1;
        pVVar4->pArray[(int)uVar1] = pVVar6;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = pNtk->vCos;
    } while (lVar11 < pVVar6->nSize);
  }
  pVVar6 = pNtk->vCis;
  lVar11 = (long)pVVar6->nSize;
  if (0 < lVar11) {
    lVar10 = 0;
    do {
      local_38 = (Abc_Obj_t *)pVVar6->pArray[lVar10];
      local_38->pNext = (Abc_Obj_t *)0x0;
      lVar10 = lVar10 + 1;
    } while (lVar11 != lVar10);
  }
  qsort(pVVar4->pArray,(long)pVVar4->nSize,8,Vec_VecSortCompare2);
  return pVVar4;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsNaive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vSupports;
    Vec_Int_t * vSuppI;
    Abc_Obj_t * pObj, * pTemp;
    int i, k;
    // set the PI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // save the CI numbers
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            continue;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vSuppI = (Vec_Int_t *)vSupp;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Vec_IntWriteEntry( vSuppI, k, (int)(ABC_PTRINT_T)pTemp->pNext );
        Vec_IntSort( vSuppI, 0 );
        // append the number of this output
        Vec_IntPush( vSuppI, i );
        // save the support in the vector
        Vec_PtrPush( vSupports, vSuppI );
    }
    // clean the CI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSuppI, i )
        printf( "%d ", Vec_IntSize(vSuppI) );
    printf( "\n" );
*/
    return vSupports;
}